

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O1

bool __thiscall
Simple::Lib::
ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
::disconnect(ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
             *this,size_t connection)

{
  SignalLink *pSVar1;
  SignalLink *this_00;
  bool bVar2;
  
  pSVar1 = this->callback_ring_;
  if (pSVar1 == (SignalLink *)0x0) {
    bVar2 = false;
  }
  else {
    this_00 = pSVar1->next;
    if (pSVar1->next == (SignalLink *)0x0) {
      this_00 = pSVar1;
    }
    for (; bVar2 = this_00 != pSVar1, bVar2; this_00 = this_00->next) {
      if (this_00 == (SignalLink *)connection) {
        SignalLink::unlink(this_00,(char *)connection);
        return bVar2;
      }
    }
  }
  return bVar2;
}

Assistant:

bool disconnect (size_t connection)
  {
      return callback_ring_ ? callback_ring_->remove_sibling (connection) : false;
  }